

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Swap(Regexp *this,Regexp *that)

{
  string *psVar1;
  anon_union_8_2_3df47e5c_for_Regexp_7 aVar2;
  Regexp *pRVar3;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 aVar5;
  Regexp *pRVar6;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  void *vthat;
  void *vthis;
  char tmp [40];
  Regexp *that_local;
  Regexp *this_local;
  
  uVar13 = this->op_;
  uVar14 = this->simple_;
  uVar15 = this->parse_flags_;
  uVar16 = this->ref_;
  uVar17 = this->nsub_;
  aVar2 = this->field_5;
  pRVar3 = this->down_;
  aVar4 = (this->field_7).field_0;
  psVar1 = (this->field_7).field_1.name_;
  uVar8 = that->op_;
  uVar9 = that->simple_;
  uVar10 = that->parse_flags_;
  uVar11 = that->ref_;
  uVar12 = that->nsub_;
  aVar5 = that->field_5;
  pRVar6 = that->down_;
  aVar7 = (that->field_7).field_0;
  (this->field_7).field_1.name_ = (that->field_7).field_1.name_;
  this->down_ = pRVar6;
  (this->field_7).field_0 = aVar7;
  this->op_ = uVar8;
  this->simple_ = uVar9;
  this->parse_flags_ = uVar10;
  this->ref_ = uVar11;
  this->nsub_ = uVar12;
  this->field_5 = aVar5;
  (that->field_7).field_1.name_ = psVar1;
  that->down_ = pRVar3;
  (that->field_7).field_0 = aVar4;
  that->op_ = uVar13;
  that->simple_ = uVar14;
  that->parse_flags_ = uVar15;
  that->ref_ = uVar16;
  that->nsub_ = uVar17;
  that->field_5 = aVar2;
  return;
}

Assistant:

void Regexp::Swap(Regexp* that) {
  // Regexp is not trivially copyable, so we cannot freely copy it with
  // memmove(3), but swapping objects like so is safe for our purposes.
  char tmp[sizeof *this];
  void* vthis = reinterpret_cast<void*>(this);
  void* vthat = reinterpret_cast<void*>(that);
  memmove(tmp, vthis, sizeof *this);
  memmove(vthis, vthat, sizeof *this);
  memmove(vthat, tmp, sizeof *this);
}